

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

void __thiscall
t_dart_generator::print_const_value
          (t_dart_generator *this,ostream *out,string *name,t_type *type,t_const_value *value,
          bool in_static,bool defval)

{
  int *piVar1;
  pointer pcVar2;
  long lVar3;
  size_t __n;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  char cVar4;
  int iVar5;
  t_const_value *ptVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  long *plVar12;
  t_type *type_00;
  size_type *psVar13;
  long lVar14;
  pointer pptVar15;
  char *pcVar16;
  t_const_value *ptVar17;
  t_const_value *ptVar18;
  bool bVar19;
  string v2;
  string val_1;
  _Alloc_hider in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  string *local_168;
  string local_160;
  _Rb_tree_node_base *local_140;
  ostream *local_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  t_type *local_d0 [2];
  undefined1 local_c0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  _Base_ptr local_70 [2];
  undefined1 local_60 [32];
  undefined1 local_40 [16];
  
  local_168 = name;
  ptVar6 = (t_const_value *)t_type::get_true_type(type);
  t_generator::indent((t_generator *)this,out);
  if (!defval) {
    pcVar16 = "public static final ";
    if (in_static) {
      pcVar16 = "public var ";
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar16 + 7,(ulong)!in_static * 9 + 4);
  }
  ptVar18 = ptVar6;
  iVar5 = (*((t_doc *)&ptVar6->mapVal_)->_vptr_t_doc[5])(ptVar6);
  if ((char)iVar5 != '\0') {
    if (!defval) {
      type_name_abi_cxx11_((string *)&stack0xfffffffffffffe78,this,(t_type *)ptVar18);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,in_stack_fffffffffffffe78._M_p,in_stack_fffffffffffffe80);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffe78._M_p != &local_178) {
        operator_delete(in_stack_fffffffffffffe78._M_p);
      }
    }
    pcVar2 = (local_168->_M_dataplus)._M_p;
    local_70[0] = (_Base_ptr)local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,pcVar2 + local_168->_M_string_length);
    name_00._M_string_length = (size_type)ptVar18;
    name_00._M_dataplus._M_p = (pointer)this;
    name_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe78._M_p;
    name_00.field_2._8_8_ = in_stack_fffffffffffffe80;
    render_const_value((string *)&stack0xfffffffffffffe78,this,out,name_00,type,ptVar18);
    if (local_70[0] != (_Base_ptr)local_60) {
      operator_delete(local_70[0]);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (out,(local_168->_M_dataplus)._M_p,local_168->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(out," = ",3);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,in_stack_fffffffffffffe78._M_p,in_stack_fffffffffffffe80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffe78._M_p == &local_178) {
      return;
    }
    operator_delete(in_stack_fffffffffffffe78._M_p);
    return;
  }
  iVar5 = (*((t_doc *)&ptVar6->mapVal_)->_vptr_t_doc[10])(ptVar6);
  if ((char)iVar5 == '\0') {
    iVar5 = (*((t_doc *)&ptVar6->mapVal_)->_vptr_t_doc[0xb])(ptVar6);
    if (((char)iVar5 == '\0') &&
       (iVar5 = (*((t_doc *)&ptVar6->mapVal_)->_vptr_t_doc[0xc])(ptVar6), (char)iVar5 == '\0')) {
      iVar5 = (*((t_doc *)&ptVar6->mapVal_)->_vptr_t_doc[0x10])(ptVar6);
      if ((char)iVar5 != '\0') {
        if (!defval) {
          type_name_abi_cxx11_((string *)&stack0xfffffffffffffe78,this,(t_type *)ptVar18);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,in_stack_fffffffffffffe78._M_p,in_stack_fffffffffffffe80);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffe78._M_p != &local_178) {
            operator_delete(in_stack_fffffffffffffe78._M_p);
          }
        }
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(local_168->_M_dataplus)._M_p,local_168->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," =",2);
        local_c0._16_8_ = local_c0 + 0x20;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x10)," ","");
        scope_up(this,out,(string *)(local_c0 + 0x10));
        if ((undefined1 *)local_c0._16_8_ != local_c0 + 0x20) {
          operator_delete((void *)local_c0._16_8_);
        }
        p_Var9 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_140 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header;
        if (p_Var9 != local_140) {
          ptVar6 = *(t_const_value **)
                    &ptVar18[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
          ptVar17 = (t_const_value *)
                    ptVar18[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            pcVar2 = (local_168->_M_dataplus)._M_p;
            local_f0[0] = local_e0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_f0,pcVar2,pcVar2 + local_168->_M_string_length);
            name_02._M_string_length = (size_type)ptVar18;
            name_02._M_dataplus._M_p = (pointer)this;
            name_02.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe78._M_p;
            name_02.field_2._8_8_ = in_stack_fffffffffffffe80;
            render_const_value((string *)&stack0xfffffffffffffe78,this,out,name_02,type,ptVar6);
            if (local_f0[0] != local_e0) {
              operator_delete(local_f0[0]);
            }
            local_130[0] = local_120;
            pcVar2 = (local_168->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_130,pcVar2,pcVar2 + local_168->_M_string_length);
            name_03._M_string_length = (size_type)ptVar18;
            name_03._M_dataplus._M_p = (pointer)this;
            name_03.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe78._M_p;
            name_03.field_2._8_8_ = in_stack_fffffffffffffe80;
            render_const_value(&local_160,this,out,name_03,type,ptVar17);
            if (local_130[0] != local_120) {
              operator_delete(local_130[0]);
            }
            poVar7 = t_generator::indent((t_generator *)this,out);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,in_stack_fffffffffffffe78._M_p,in_stack_fffffffffffffe80);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_160._M_dataplus._M_p,local_160._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)in_stack_fffffffffffffe78._M_p != &local_178) {
              operator_delete(in_stack_fffffffffffffe78._M_p);
            }
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != local_140);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_60 + 0x10),";",&::endl_abi_cxx11_);
        scope_down(this,out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_60 + 0x10));
        if ((undefined1 *)local_60._16_8_ != local_60 + 0x20) {
          operator_delete((void *)local_60._16_8_);
        }
        goto LAB_001b5afb;
      }
      iVar5 = (*((t_doc *)&ptVar6->mapVal_)->_vptr_t_doc[0xe])(ptVar6);
      if (((char)iVar5 == '\0') &&
         (cVar4 = (**(code **)(*(long *)&(ptVar18->mapVal_)._M_t._M_impl + 0x78))(), cVar4 == '\0'))
      {
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __cxa_allocate_exception(0x20);
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (**(code **)(*(long *)&(ptVar18->mapVal_)._M_t._M_impl + 0x18))();
        std::operator+(pbVar10,"compiler error: no const of type ",pbVar11);
        __cxa_throw(pbVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      if (!defval) {
        type_name_abi_cxx11_((string *)&stack0xfffffffffffffe78,this,(t_type *)ptVar18);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,in_stack_fffffffffffffe78._M_p,in_stack_fffffffffffffe80);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffe78._M_p != &local_178) {
          operator_delete(in_stack_fffffffffffffe78._M_p);
        }
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(local_168->_M_dataplus)._M_p,local_168->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
      ptVar6 = ptVar18;
      cVar4 = (**(code **)(*(long *)&(ptVar18->mapVal_)._M_t._M_impl + 0x70))(ptVar18);
      if (cVar4 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(out,"new ",4);
        type_name_abi_cxx11_((string *)&stack0xfffffffffffffe78,this,(t_type *)ptVar18);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,in_stack_fffffffffffffe78._M_p,in_stack_fffffffffffffe80);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,".from([",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffe78._M_p != &local_178) {
          operator_delete(in_stack_fffffffffffffe78._M_p);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      ptVar18 = *(t_const_value **)&ptVar6[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      pptVar15 = (value->listVal_).
                 super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (pptVar15 !=
          (value->listVal_).super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          pcVar2 = (local_168->_M_dataplus)._M_p;
          local_110[0] = local_100;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_110,pcVar2,pcVar2 + local_168->_M_string_length);
          name_04._M_string_length = (size_type)ptVar6;
          name_04._M_dataplus._M_p = (pointer)this;
          name_04.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe78._M_p;
          name_04.field_2._8_8_ = in_stack_fffffffffffffe80;
          render_const_value((string *)&stack0xfffffffffffffe78,this,out,name_04,type,ptVar18);
          if (local_110[0] != local_100) {
            operator_delete(local_110[0]);
          }
          poVar7 = t_generator::indent((t_generator *)this,out);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,in_stack_fffffffffffffe78._M_p,in_stack_fffffffffffffe80);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffe78._M_p != &local_178) {
            operator_delete(in_stack_fffffffffffffe78._M_p);
          }
          pptVar15 = pptVar15 + 1;
        } while (pptVar15 !=
                 (value->listVal_).
                 super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      cVar4 = (**(code **)(*(long *)&(ptVar6->mapVal_)._M_t._M_impl + 0x70))();
      out = t_generator::indent((t_generator *)this,out);
      if (cVar4 == '\0') {
        pcVar16 = "]);";
        lVar14 = 3;
      }
      else {
        pcVar16 = "];";
        lVar14 = 2;
      }
    }
    else {
      type_name_abi_cxx11_((string *)&stack0xfffffffffffffe78,this,(t_type *)ptVar6);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,in_stack_fffffffffffffe78._M_p,in_stack_fffffffffffffe80);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(local_168->_M_dataplus)._M_p,local_168->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," = new ",7);
      type_name_abi_cxx11_(&local_160,this,(t_type *)ptVar18);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_160._M_dataplus._M_p,local_160._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffe78._M_p != &local_178) {
        operator_delete(in_stack_fffffffffffffe78._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      p_Var8 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_140 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var8 != local_140) {
        ptVar6 = ptVar18;
        local_138 = out;
        do {
          plVar12 = *(long **)&(ptVar18->identifierVal_).field_2;
          if (plVar12 == *(long **)((long)&(ptVar18->identifierVal_).field_2 + 8)) {
            ptVar17 = (t_const_value *)0x0;
          }
          else {
            ptVar17 = (t_const_value *)0x0;
            ptVar18 = ptVar6;
            do {
              lVar14 = *plVar12;
              lVar3 = *(long *)(*(long *)(p_Var8 + 1) + 0x48);
              in_stack_fffffffffffffe78._M_p = (pointer)&local_178;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&stack0xfffffffffffffe78,lVar3,
                         *(long *)(*(long *)(p_Var8 + 1) + 0x50) + lVar3);
              __n = *(size_t *)(lVar14 + 0x70);
              if (__n == in_stack_fffffffffffffe80) {
                if (__n == 0) {
                  bVar19 = true;
                }
                else {
                  iVar5 = bcmp(*(void **)(lVar14 + 0x68),in_stack_fffffffffffffe78._M_p,__n);
                  bVar19 = iVar5 == 0;
                }
              }
              else {
                bVar19 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffe78._M_p != &local_178) {
                operator_delete(in_stack_fffffffffffffe78._M_p);
              }
              if (bVar19) {
                ptVar17 = *(t_const_value **)(*plVar12 + 0x60);
              }
              plVar12 = plVar12 + 1;
              ptVar6 = ptVar18;
            } while (plVar12 != *(long **)((long)&(ptVar18->identifierVal_).field_2 + 8));
          }
          if (ptVar17 == (t_const_value *)0x0) {
            pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (**(code **)(*(long *)&(ptVar18->mapVal_)._M_t._M_impl + 0x18))(ptVar18);
            std::operator+(&local_160,"type error: ",pbVar11);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_160);
            psVar13 = (size_type *)(plVar12 + 2);
            if ((size_type *)*plVar12 == psVar13) {
              local_178._M_allocated_capacity = *psVar13;
              local_178._8_4_ = (undefined4)plVar12[3];
              local_178._12_4_ = *(undefined4 *)((long)plVar12 + 0x1c);
            }
            else {
              local_178._M_allocated_capacity = *psVar13;
            }
            *plVar12 = (long)psVar13;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            lVar14 = *(long *)(*(long *)(p_Var8 + 1) + 0x48);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,lVar14,*(long *)(*(long *)(p_Var8 + 1) + 0x50) + lVar14);
            std::operator+(pbVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&stack0xfffffffffffffe78,&local_90);
            __cxa_throw(pbVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          pcVar2 = (local_168->_M_dataplus)._M_p;
          type_00 = (t_type *)local_c0;
          local_d0[0] = (t_type *)local_c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,pcVar2,pcVar2 + local_168->_M_string_length);
          out = local_138;
          name_01._M_string_length = (size_type)ptVar6;
          name_01._M_dataplus._M_p = (pointer)this;
          name_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe78._M_p;
          name_01.field_2._8_8_ = in_stack_fffffffffffffe80;
          render_const_value((string *)&stack0xfffffffffffffe78,this,local_138,name_01,type_00,
                             ptVar17);
          if (local_d0[0] != (t_type *)local_c0) {
            operator_delete(local_d0[0]);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          poVar7 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"..",2);
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          lVar14 = *(long *)(*(long *)(p_Var8 + 1) + 0x48);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,lVar14,*(long *)(*(long *)(p_Var8 + 1) + 0x50) + lVar14);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_160._M_dataplus._M_p,local_160._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,in_stack_fffffffffffffe78._M_p,in_stack_fffffffffffffe80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffe78._M_p != &local_178) {
            operator_delete(in_stack_fffffffffffffe78._M_p);
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != local_140);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      pcVar16 = ";";
      lVar14 = 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar16,lVar14);
  }
  else {
    if (!defval) {
      type_name_abi_cxx11_((string *)&stack0xfffffffffffffe78,this,(t_type *)ptVar18);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,in_stack_fffffffffffffe78._M_p,in_stack_fffffffffffffe80);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffe78._M_p != &local_178) {
        operator_delete(in_stack_fffffffffffffe78._M_p);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (out,(local_168->_M_dataplus)._M_p,local_168->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(out," = ",3);
    t_const_value::get_integer(value);
    poVar7 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
    out = std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
LAB_001b5afb:
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_dart_generator::print_const_value(std::ostream& out,
                                        string name,
                                        t_type* type,
                                        t_const_value* value,
                                        bool in_static,
                                        bool defval) {
  type = get_true_type(type);

  indent(out);
  if (!defval) {
    out << (in_static ? "var " : "static final ");
  }
  if (type->is_base_type()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    string v2 = render_const_value(out, name, type, value);
    out << name;
    out << " = " << v2 << ";" << endl << endl;
  } else if (type->is_enum()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    out << name;
    out << " = " << value->get_integer() << ";" << endl << endl;
  } else if (type->is_struct() || type->is_xception()) {
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    out << type_name(type) << " " << name << " = new " << type_name(type) << "()";
    indent_up();
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      string val = render_const_value(out, name, field_type, v_iter->second);
      out << endl;
      indent(out) << ".." << v_iter->first->get_string() << " = " << val;
    }
    indent_down();
    out << ";" << endl;
  } else if (type->is_map()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    out << name << " =";
    scope_up(out);

    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string key = render_const_value(out, name, ktype, v_iter->first);
      string val = render_const_value(out, name, vtype, v_iter->second);
      indent(out) << key << ": " << val << "," << endl;
    }
    scope_down(out, ";" + endl);

    out << endl;
  } else if (type->is_list() || type->is_set()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    out << name << " = ";
    t_type* etype;
    if (type->is_list()) {
      out << "[" << endl;
      etype = ((t_list*)type)->get_elem_type();
    } else {
      out << "new " << type_name(type) << ".from([" << endl;
      etype = ((t_set*)type)->get_elem_type();
    }
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;

    indent_up();
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, name, etype, *v_iter);
      indent(out) << val << "," << endl;
    }
    indent_down();

    if (type->is_list()) {
      indent(out) << "];" << endl;
    } else {
      indent(out) << "]);" << endl;
    }

  } else {
    throw "compiler error: no const of type " + type->get_name();
  }
}